

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void avx::Accumulate(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t *outY,
                    uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t *puVar5;
  uint32_t *puVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [32];
  
  if (imageY != imageYEnd) {
    puVar6 = outY + totalSimdWidth;
    puVar5 = imageY + totalSimdWidth;
    do {
      if (simdWidth != 0) {
        lVar7 = 0;
        do {
          auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          auVar2 = vpunpcklbw_avx2(*(undefined1 (*) [32])(imageY + lVar7),auVar9);
          auVar1 = vpunpckhbw_avx2(*(undefined1 (*) [32])(imageY + lVar7),auVar9);
          auVar3 = vpunpcklwd_avx2(auVar2,auVar9);
          auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])(outY + lVar7));
          auVar2 = vpunpckhwd_avx2(auVar2,auVar9);
          auVar4 = vpunpcklwd_avx2(auVar1,auVar9);
          auVar1 = vpunpckhwd_avx2(auVar1,auVar9);
          *(undefined1 (*) [32])(outY + lVar7) = auVar3;
          auVar3 = vpaddd_avx2(auVar2,*(undefined1 (*) [32])(outY + lVar7 + 8));
          *(undefined1 (*) [32])(outY + lVar7 + 8) = auVar3;
          auVar3 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])(outY + lVar7 + 0x10));
          *(undefined1 (*) [32])(outY + lVar7 + 0x10) = auVar3;
          auVar3 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])(outY + lVar7 + 0x18));
          *(undefined1 (*) [32])(outY + lVar7 + 0x18) = auVar3;
          lVar7 = lVar7 + 0x20;
        } while ((ulong)simdWidth << 5 != lVar7);
      }
      if (nonSimdWidth != 0) {
        uVar8 = 0;
        do {
          puVar6[uVar8] = puVar6[uVar8] + (uint)puVar5[uVar8];
          uVar8 = uVar8 + 1;
        } while (nonSimdWidth != uVar8);
      }
      imageY = imageY + rowSize;
      outY = outY + (nonSimdWidth + totalSimdWidth);
      puVar6 = puVar6 + (nonSimdWidth + totalSimdWidth);
      puVar5 = puVar5 + rowSize;
    } while (imageY != imageYEnd);
  }
  return;
}

Assistant:

void Accumulate( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t * outY, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        simd zero = _mm256_setzero_si256();

        const uint32_t width = totalSimdWidth + nonSimdWidth;

        for( ; imageY != imageYEnd; imageY += rowSize, outY += width ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;
            simd       * dst    = reinterpret_cast <simd*> (outY);

            for( ; src != srcEnd; ++src ) {
                simd data = _mm256_loadu_si256( src );

                const simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                const simd dataHi  = _mm256_unpackhi_epi8( data, zero );

                const simd data_1 = _mm256_unpacklo_epi16( dataLo, zero );
                const simd data_2 = _mm256_unpackhi_epi16( dataLo, zero );
                const simd data_3 = _mm256_unpacklo_epi16( dataHi, zero );
                const simd data_4 = _mm256_unpackhi_epi16( dataHi, zero );

                _mm256_storeu_si256( dst, _mm256_add_epi32( data_1, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_2, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_3, _mm256_loadu_si256( dst ) ) );
                ++dst;
                _mm256_storeu_si256( dst, _mm256_add_epi32( data_4, _mm256_loadu_si256( dst ) ) );
                ++dst;
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;
                uint32_t      * outX      = outY + totalSimdWidth;

                for( ; imageX != imageXEnd; ++imageX, ++outX )
                    (*outX) += (*imageX);
            }   
        }
    }